

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

double __thiscall gulps::log(gulps *this,double __x)

{
  message *in_RSI;
  _List_node_base *p_Var1;
  double extraout_XMM0_Qa;
  double __x_00;
  double extraout_XMM0_Qa_00;
  message msg;
  message mStack_d8;
  
  message::message(&mStack_d8,in_RSI);
  p_Var1 = (_List_node_base *)this;
  __x_00 = extraout_XMM0_Qa;
  while (p_Var1 = (((list<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
                     *)&p_Var1->_M_next)->
                  super__List_base<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>,_std::allocator<std::unique_ptr<gulps::gulps_output,_std::default_delete<gulps::gulps_output>_>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next, p_Var1 != (_List_node_base *)this
        ) {
    __x_00 = gulps_output::log(*(gulps_output **)(p_Var1 + 1),__x_00);
  }
  message::~message(&mStack_d8);
  return extraout_XMM0_Qa_00;
}

Assistant:

void log(message&& in_msg)
	{
		message msg = std::move(in_msg);
		
		for(std::unique_ptr<gulps_output>& out : outputs)
			out->log(msg);
	}